

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall
CGraphics_Threaded::QuadsText(CGraphics_Threaded *this,float x,float y,float Size,char *pText)

{
  char cVar1;
  char *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  char c;
  float StartX;
  CQuadItem QuadItem;
  char *local_38;
  float local_28;
  float local_24;
  CQuadItem local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = in_RSI;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  while (*local_38 != '\0') {
    cVar1 = *local_38;
    local_38 = local_38 + 1;
    if (cVar1 == '\n') {
      local_28 = in_XMM2_Da + local_28;
      local_24 = in_XMM0_Da;
    }
    else {
      (**(code **)(*in_RDI + 0xd0))
                ((float)((int)cVar1 % 0x10) / 16.0,(float)((int)cVar1 / 0x10) / 16.0,
                 (float)((int)cVar1 % 0x10) / 16.0 + 0.0625,
                 (float)((int)cVar1 / 0x10) / 16.0 + 0.0625,in_RDI,0xffffffff,
                 (long)(int)cVar1 % 0x10 & 0xffffffff);
      IGraphics::CQuadItem::CQuadItem(&local_18,local_24,local_28,in_XMM2_Da,in_XMM2_Da);
      (**(code **)(*in_RDI + 0xe8))(in_RDI,&local_18,1);
      local_24 = in_XMM2_Da / 2.0 + local_24;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGraphics_Threaded::QuadsText(float x, float y, float Size, const char *pText)
{
	float StartX = x;

	while(*pText)
	{
		char c = *pText;
		pText++;

		if(c == '\n')
		{
			x = StartX;
			y += Size;
		}
		else
		{
			QuadsSetSubset(
				(c%16)/16.0f,
				(c/16)/16.0f,
				(c%16)/16.0f+1.0f/16.0f,
				(c/16)/16.0f+1.0f/16.0f);

			CQuadItem QuadItem(x, y, Size, Size);
			QuadsDrawTL(&QuadItem, 1);
			x += Size/2;
		}
	}
}